

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O3

void __thiscall cppcms::url_mapper::set_value(url_mapper *this,string *key,string *value)

{
  data *pdVar1;
  pointer pcVar2;
  url_mapper *puVar3;
  mapped_type *pmVar4;
  undefined1 local_58 [16];
  _Alloc_hider local_48;
  char local_38 [24];
  
  puVar3 = root_mapper(this);
  pdVar1 = (puVar3->d).ptr_;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = (char *)0x0;
  pcVar2 = (key->_M_dataplus)._M_p;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + key->_M_string_length);
  pmVar4 = std::
           map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pdVar1->helpers,(key_type *)local_58);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  return;
}

Assistant:

void url_mapper::set_value(std::string const &key,std::string const &value)
	{
		root_mapper()->d->helpers[key]=value;
	}